

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_31(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_a0;
  shared_ptr<LNode> local_90;
  LNodeIStmt local_80;
  undefined4 local_5c;
  shared_ptr<LNodeData<LNodeIStmt>_> r;
  undefined1 local_38 [8];
  shared_ptr<LNode> then_branch;
  shared_ptr<LNode> condition;
  LParser *this_local;
  
  get_node((LParser *)&then_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ,in_ESI);
  get_node((LParser *)local_38,in_ESI);
  local_5c = 0x31;
  std::shared_ptr<LNode>::shared_ptr
            (&local_90,
             (shared_ptr<LNode> *)
             &then_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr(&local_a0,(shared_ptr<LNode> *)local_38);
  LNodeIStmt::LNodeIStmt(&local_80,&local_90,&local_a0);
  std::make_shared<LNodeData<LNodeIStmt>,LNodeType,LNodeIStmt>
            ((LNodeType *)&stack0xffffffffffffffa8,(LNodeIStmt *)&stack0xffffffffffffffa4);
  LNodeIStmt::~LNodeIStmt(&local_80);
  std::shared_ptr<LNode>::~shared_ptr(&local_a0);
  std::shared_ptr<LNode>::~shared_ptr(&local_90);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeIStmt>,void>
            ((shared_ptr<LNode> *)this,
             (shared_ptr<LNodeData<LNodeIStmt>_> *)&stack0xffffffffffffffa8);
  std::shared_ptr<LNodeData<LNodeIStmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeIStmt>_> *)&stack0xffffffffffffffa8);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &then_branch.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_31() {
    // IStmt : IF Expr Brs THEN Brs NIEStmts END Brs
    auto condition = this->get_node(7);
    auto then_branch = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeIStmt>>(
            LNodeType::IStmt,
            LNodeIStmt(condition, then_branch)
    );
    return r;
}